

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  byte bVar1;
  string *psVar2;
  ostream *poVar3;
  bool bVar4;
  string local_2b8;
  uint local_294;
  undefined1 local_290 [8];
  cmGeneratedFileStream fout;
  undefined1 local_38 [8];
  string filename;
  cmLocalGenerator *lg_local;
  cmExtraKateGenerator *this_local;
  
  filename.field_2._8_8_ = lg;
  psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  std::__cxx11::string::string((string *)local_38,(string *)psVar2);
  std::__cxx11::string::operator+=((string *)local_38,"/.kateproject");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_290,(string *)local_38,false,None);
  bVar1 = std::ios::operator!((ios *)(local_290 + (long)*(_func_int **)((long)local_290 + -0x18)));
  bVar4 = (bVar1 & 1) != 0;
  if (!bVar4) {
    poVar3 = std::operator<<((ostream *)local_290,"{\n\t\"name\": \"");
    poVar3 = std::operator<<(poVar3,(string *)&this->ProjectName);
    poVar3 = std::operator<<(poVar3,"\",\n\t\"directory\": \"");
    psVar2 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_
                       ((cmLocalGenerator *)filename.field_2._8_8_);
    poVar3 = std::operator<<(poVar3,(string *)psVar2);
    poVar3 = std::operator<<(poVar3,"\",\n\t\"files\": [ { ");
    GenerateFilesString_abi_cxx11_(&local_2b8,this,(cmLocalGenerator *)filename.field_2._8_8_);
    poVar3 = std::operator<<(poVar3,(string *)&local_2b8);
    std::operator<<(poVar3,"} ],\n");
    std::__cxx11::string::~string((string *)&local_2b8);
    WriteTargets(this,(cmLocalGenerator *)filename.field_2._8_8_,(cmGeneratedFileStream *)local_290)
    ;
    std::operator<<((ostream *)local_290,"}\n");
  }
  local_294 = (uint)bVar4;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_290);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(
  const cmLocalGenerator* lg) const
{
  std::string filename = lg->GetBinaryDirectory();
  filename += "/.kateproject";
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  /* clang-format off */
  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << lg->GetSourceDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(lg) << "} ],\n";
  /* clang-format on */
  this->WriteTargets(lg, fout);
  fout << "}\n";
}